

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void btreeLockCarefully(Btree *p)

{
  int iVar1;
  undefined8 *in_RDI;
  Btree *pLater;
  sqlite3_mutex *in_stack_ffffffffffffffe8;
  Btree *p_00;
  long lVar2;
  
  iVar1 = sqlite3_mutex_try(in_stack_ffffffffffffffe8);
  if (iVar1 == 0) {
    *(undefined8 *)(in_RDI[1] + 8) = *in_RDI;
    *(undefined1 *)((long)in_RDI + 0x12) = 1;
  }
  else {
    for (p_00 = (Btree *)in_RDI[4]; p_00 != (Btree *)0x0; p_00 = p_00->pNext) {
      if (p_00->locked != '\0') {
        unlockBtreeMutex(p_00);
      }
    }
    lockBtreeMutex((Btree *)0x168959);
    for (lVar2 = in_RDI[4]; lVar2 != 0; lVar2 = *(long *)(lVar2 + 0x20)) {
      if (*(int *)(lVar2 + 0x14) != 0) {
        lockBtreeMutex((Btree *)0x168984);
      }
    }
  }
  return;
}

Assistant:

static void SQLITE_NOINLINE btreeLockCarefully(Btree *p){
  Btree *pLater;

  /* In most cases, we should be able to acquire the lock we
  ** want without having to go through the ascending lock
  ** procedure that follows.  Just be sure not to block.
  */
  if( sqlite3_mutex_try(p->pBt->mutex)==SQLITE_OK ){
    p->pBt->db = p->db;
    p->locked = 1;
    return;
  }

  /* To avoid deadlock, first release all locks with a larger
  ** BtShared address.  Then acquire our lock.  Then reacquire
  ** the other BtShared locks that we used to hold in ascending
  ** order.
  */
  for(pLater=p->pNext; pLater; pLater=pLater->pNext){
    assert( pLater->sharable );
    assert( pLater->pNext==0 || pLater->pNext->pBt>pLater->pBt );
    assert( !pLater->locked || pLater->wantToLock>0 );
    if( pLater->locked ){
      unlockBtreeMutex(pLater);
    }
  }
  lockBtreeMutex(p);
  for(pLater=p->pNext; pLater; pLater=pLater->pNext){
    if( pLater->wantToLock ){
      lockBtreeMutex(pLater);
    }
  }
}